

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_lattice.c
# Opt level: O0

void path_insert(ps_astar_t *nbest,ps_latpath_t *newpath,int32 total_score)

{
  ps_latpath_s *ppVar1;
  int local_34;
  ps_latpath_s *ppStack_30;
  int32 i;
  ps_latpath_t *p;
  ps_latpath_t *prev;
  int32 total_score_local;
  ps_latpath_t *newpath_local;
  ps_astar_t *nbest_local;
  
  p = (ps_latpath_t *)0x0;
  local_34 = 0;
  for (ppStack_30 = nbest->path_list;
      (local_34 < 500 && ppStack_30 != (ps_latpath_s *)0x0 &&
      (total_score <= ppStack_30->score + (ppStack_30->node->info).fanin));
      ppStack_30 = ppStack_30->next) {
    p = ppStack_30;
    local_34 = local_34 + 1;
  }
  if (local_34 < 500) {
    newpath->next = ppStack_30;
    if (p == (ps_latpath_t *)0x0) {
      nbest->path_list = newpath;
    }
    else {
      p->next = newpath;
    }
    if (ppStack_30 == (ps_latpath_s *)0x0) {
      nbest->path_tail = newpath;
    }
    nbest->n_path = nbest->n_path + 1;
    nbest->n_hyp_insert = nbest->n_hyp_insert + 1;
    nbest->insert_depth = local_34 + nbest->insert_depth;
  }
  else {
    nbest->path_tail = p;
    p->next = (ps_latpath_s *)0x0;
    nbest->n_path = 500;
    __listelem_free__(nbest->latpath_alloc,newpath,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                      ,0x66e);
    nbest->n_hyp_reject = nbest->n_hyp_reject + 1;
    while (ppStack_30 != (ps_latpath_s *)0x0) {
      ppVar1 = ppStack_30->next;
      __listelem_free__(nbest->latpath_alloc,ppStack_30,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                        ,0x673);
      nbest->n_hyp_reject = nbest->n_hyp_reject + 1;
      ppStack_30 = ppVar1;
    }
  }
  return;
}

Assistant:

static void
path_insert(ps_astar_t *nbest, ps_latpath_t *newpath, int32 total_score)
{
    ps_latpath_t *prev, *p;
    int32 i;

    prev = NULL;
    for (i = 0, p = nbest->path_list; (i < MAX_PATHS) && p; p = p->next, i++) {
        if ((p->score + p->node->info.rem_score) < total_score)
            break;
        prev = p;
    }

    /* newpath should be inserted between prev and p */
    if (i < MAX_PATHS) {
        /* Insert new partial hyp */
        newpath->next = p;
        if (!prev)
            nbest->path_list = newpath;
        else
            prev->next = newpath;
        if (!p)
            nbest->path_tail = newpath;

        nbest->n_path++;
        nbest->n_hyp_insert++;
        nbest->insert_depth += i;
    }
    else {
        /* newpath score too low; reject it and also prune paths beyond MAX_PATHS */
        nbest->path_tail = prev;
        prev->next = NULL;
        nbest->n_path = MAX_PATHS;
        listelem_free(nbest->latpath_alloc, newpath);

        nbest->n_hyp_reject++;
        for (; p; p = newpath) {
            newpath = p->next;
            listelem_free(nbest->latpath_alloc, p);
            nbest->n_hyp_reject++;
        }
    }
}